

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O1

Solution * ConstructionHeuristics::FirstFit(Solution *solution,string *skillId)

{
  pointer pvVar1;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar2;
  ulong uVar3;
  const_reverse_iterator dayIndex;
  pointer pvVar4;
  
  pvVar2 = Solution::getTurns(solution);
  pvVar4 = (pvVar2->
           super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = Solution::getTurns(solution);
  pvVar1 = (pvVar2->
           super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)pvVar4 - (long)pvVar1;
  if (uVar3 != 0) {
    do {
      assignGivenDay(solution,(int)(uVar3 >> 3) * -0x55555555 - 1,skillId);
      pvVar4 = pvVar4 + -1;
      uVar3 = uVar3 - 0x18;
    } while (pvVar4 != pvVar1);
  }
  return solution;
}

Assistant:

Solution *ConstructionHeuristics::FirstFit(Solution *solution, const string &skillId) {
    auto rbegin = solution->getTurns().rbegin();
    auto rend = solution->getTurns().rend();

    for (auto dayIndex = rbegin; dayIndex != rend; dayIndex++)
        assignGivenDay(solution, (unsigned int) distance(dayIndex, rend)-1, skillId);

    return solution;
}